

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

Instr * __thiscall
IRBuilder::BuildProfiledCallI
          (IRBuilder *this,OpCode opcode,uint32 offset,RegSlot returnValue,RegSlot function,
          ArgSlot argCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  uint32 *puVar1;
  code *pcVar2;
  int iVar3;
  bool bVar4;
  BOOLEAN BVar5;
  uint uVar6;
  uint uVar7;
  BVIndex BVar8;
  undefined4 *puVar9;
  JITTimeFunctionBody *pJVar10;
  JITTimeProfileInfo *pJVar11;
  FunctionJITTimeInfo *pFVar12;
  FunctionJITTimeInfo *this_00;
  Instr *pIVar13;
  BVFixed *pBVar14;
  uint i;
  undefined6 in_register_00000032;
  undefined6 in_register_0000008a;
  byte bVar15;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  RegSlot local_40;
  uint32 local_3c;
  undefined4 local_38;
  OpCode local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [3];
  OpCode newOpcode;
  ValueType returnType;
  
  local_38 = (undefined4)CONCAT62(in_register_0000008a,argCount);
  local_40 = returnValue;
  local_3c = offset;
  ValueType::ValueType((ValueType *)&local_32[0].field_0);
  iVar3 = (int)CONCAT62(in_register_00000032,opcode);
  local_34 = opcode;
  if ((iVar3 - 0xc5U < 2) || (iVar3 == 0x161)) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(&local_34);
    if ((local_34 != NewScObject) && (local_34 != NewScObjectSpread)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x194b,
                         "(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread)"
                         ,
                         "newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread"
                        );
      if (!bVar4) goto LAB_004d4355;
      *puVar9 = 0;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar4 = JITTimeFunctionBody::HasProfileInfo(pJVar10);
    if (!bVar4) {
      bVar15 = 0;
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(UninitializedObject);
      goto LAB_004d417f;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pJVar11 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar10);
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         JITTimeProfileInfo::GetReturnType(pJVar11,opcode,profileId);
  }
  else {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar4 = JITTimeFunctionBody::HasProfileInfo(pJVar10);
    i = (uint)profileId;
    if (bVar4) {
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pJVar11 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar10);
      local_32[0].field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           JITTimeProfileInfo::GetReturnType(pJVar11,opcode,profileId);
    }
    if (opcode < ProfiledReturnTypeCallI) {
      local_34 = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
      bVar4 = DoBailOnNoProfile(this);
      if (bVar4) {
        pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
        if (pFVar12 == (FunctionJITTimeInfo *)0x0) {
LAB_004d4336:
          bVar15 = 0;
        }
        else {
          pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
          bVar4 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
          if (bVar4) {
            pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
            uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
            this_00 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
            uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
            bVar4 = Js::Phases::IsEnabled
                              ((Phases *)&DAT_015a4e90,InlineInJitLoopBodyPhase,uVar6,uVar7);
            if ((pFVar12 != (FunctionJITTimeInfo *)0x0) && (!bVar4)) goto LAB_004d4223;
LAB_004d432e:
            this->callTreeHasSomeProfileInfo = true;
            goto LAB_004d4336;
          }
          if (pFVar12 == (FunctionJITTimeInfo *)0x0) goto LAB_004d432e;
LAB_004d4223:
          pBVar14 = FunctionJITTimeInfo::GetInlineesBV(pFVar12);
          if (pBVar14 == (BVFixed *)0x0) goto LAB_004d432e;
          pBVar14 = FunctionJITTimeInfo::GetInlineesBV(pFVar12);
          BVar8 = BVFixed::Length(pBVar14);
          if (BVar8 <= i) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar9 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1968,"(profileId < inlinerData->GetInlineesBV()->Length())",
                               "profileId < inlinerData->GetInlineesBV()->Length()");
            if (!bVar4) {
LAB_004d4355:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar9 = 0;
          }
          pBVar14 = FunctionJITTimeInfo::GetInlineesBV(pFVar12);
          BVar5 = BVFixed::Test(pBVar14,i);
          if (BVar5 != '\0') {
            pJVar10 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->topFunc->m_workItem);
            uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
            pFVar12 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->topFunc->m_workItem);
            uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar12);
            i = 0x37;
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_0159c0e0,BailOnNoProfilePhase,uVar6,uVar7);
            if ((!bVar4) ||
               ((-1 < (int)DAT_015a4e68 && (this->m_func->m_callSiteCount < DAT_015a4e68))))
            goto LAB_004d432e;
          }
          InsertBailOnNoProfile(this,i);
          bVar15 = 1;
        }
        puVar1 = &this->m_func->m_callSiteCount;
        *puVar1 = *puVar1 + 1;
        goto LAB_004d417f;
      }
    }
  }
  bVar15 = 0;
LAB_004d417f:
  pIVar13 = BuildCallI_Helper(this,local_34,local_3c,local_40,function,(ArgSlot)local_38,profileId,
                              flags,inlineCacheIndex);
  pIVar13->field_0x38 = pIVar13->field_0x38 & 0xfe | bVar15;
  if (pIVar13->m_dst != (Opnd *)0x0) {
    local_44 = (pIVar13->m_dst->m_valueType).field_0;
    bVar4 = ValueType::IsUninitialized((ValueType *)&local_44.field_0);
    if (!bVar4) {
      local_42 = (pIVar13->m_dst->m_valueType).field_0;
      bVar4 = ValueType::operator==((ValueType *)&local_42.field_0,(ValueType)0x10);
      if (!bVar4) {
        return pIVar13;
      }
    }
    IR::Opnd::SetValueType(pIVar13->m_dst,(ValueType)local_32[0].field_0);
  }
  return pIVar13;
}

Assistant:

IR::Instr *
IRBuilder::BuildProfiledCallI(Js::OpCode opcode, uint32 offset, Js::RegSlot returnValue, Js::RegSlot function,
                            Js::ArgSlot argCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    Js::OpCode newOpcode;
    ValueType returnType;
    bool isProtectedByNoProfileBailout = false;

    if (opcode == Js::OpCode::ProfiledNewScObject || opcode == Js::OpCode::ProfiledNewScObjectWithICIndex
        || opcode == Js::OpCode::ProfiledNewScObjectSpread)
    {
        newOpcode = opcode;
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
        Assert(newOpcode == Js::OpCode::NewScObject || newOpcode == Js::OpCode::NewScObjectSpread);
        if (!this->m_func->HasProfileInfo())
        {
            returnType = ValueType::GetObject(ObjectType::UninitializedObject);
        }
        else
        {
            // If we have profile data, make use of it
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }
    }
    else
    {
        if (this->m_func->HasProfileInfo())
        {
            returnType = this->m_func->GetReadOnlyProfileInfo()->GetReturnType(opcode, profileId);
        }

        if (opcode < Js::OpCode::ProfiledReturnTypeCallI)
        {
            newOpcode = Js::OpCodeUtil::ConvertProfiledCallOpToNonProfiled(opcode);
            if(DoBailOnNoProfile())
            {
                if(this->m_func->GetWorkItem()->GetJITTimeInfo())
                {
                    const FunctionJITTimeInfo *inlinerData = this->m_func->GetWorkItem()->GetJITTimeInfo();
                    if (!(this->IsLoopBody() && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->m_func))
                        && inlinerData && inlinerData->GetInlineesBV())
                    {
                        AssertOrFailFast(profileId < inlinerData->GetInlineesBV()->Length());
                        if (!inlinerData->GetInlineesBV()->Test(profileId)
#if DBG
                            || (PHASE_STRESS(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc())
                                && (CONFIG_FLAG(SkipFuncCountForBailOnNoProfile) < 0
                                    || this->m_func->m_callSiteCount >= (uint)CONFIG_FLAG(SkipFuncCountForBailOnNoProfile)))
#endif
                            )
                        {
                            this->InsertBailOnNoProfile(offset);
                            isProtectedByNoProfileBailout = true;
                        }
                    }

                    if (!isProtectedByNoProfileBailout)
                    {
                        this->callTreeHasSomeProfileInfo = true;
                    }
                }
#if DBG
                this->m_func->m_callSiteCount++;
#endif
            }
        }
        else
        {
            // Changing this opcode into a non ReturnTypeCall* opcode is done in BuildCallI_Helper
            newOpcode = opcode;
        }
    }
    IR::Instr * callInstr = BuildCallI_Helper(newOpcode, offset, returnValue, function, argCount, profileId, flags, inlineCacheIndex);
    callInstr->isCallInstrProtectedByNoProfileBailout = isProtectedByNoProfileBailout;

    if (callInstr->GetDst() && (callInstr->GetDst()->GetValueType().IsUninitialized() || callInstr->GetDst()->GetValueType() == ValueType::UninitializedObject))
    {
        callInstr->GetDst()->SetValueType(returnType);
    }
    return callInstr;
}